

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O0

void __thiscall despot::BaseRockSample::PrintAction(BaseRockSample *this)

{
  ostream *in_RDX;
  ACT_TYPE in_ESI;
  
  PrintAction((BaseRockSample *)
              &this[-1].transition_probabilities_.
               super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,in_ESI,in_RDX);
  return;
}

Assistant:

void BaseRockSample::PrintAction(ACT_TYPE action, ostream& out) const {
	if (action < E_SAMPLE)
		out << Compass::CompassString[action] << endl;
	if (action == E_SAMPLE)
		out << "Sample" << endl;
	if (action > E_SAMPLE)
		out << "Check " << (action - E_SAMPLE - 1) << endl;
}